

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O3

void __thiscall fasttext::Autotune::printArgs(Autotune *this,Args *args,Args *autotuneArgs)

{
  long *plVar1;
  ostream *poVar2;
  string local_38;
  
  if (2 < autotuneArgs->verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"epoch = ",8);
    plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,args->epoch);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
    if (2 < autotuneArgs->verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"lr = ",5);
      poVar2 = std::ostream::_M_insert<double>(args->lr);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (2 < autotuneArgs->verbose) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dim = ",6);
        plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,args->dim);
        std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
        std::ostream::put((char)plVar1);
        std::ostream::flush();
        if (2 < autotuneArgs->verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"minCount = ",0xb);
          plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,args->minCount);
          std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
          std::ostream::put((char)plVar1);
          std::ostream::flush();
          if (2 < autotuneArgs->verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"wordNgrams = ",0xd);
            plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,args->wordNgrams);
            std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
            std::ostream::put((char)plVar1);
            std::ostream::flush();
            if (2 < autotuneArgs->verbose) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"minn = ",7);
              plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,args->minn);
              std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
              std::ostream::put((char)plVar1);
              std::ostream::flush();
              if (2 < autotuneArgs->verbose) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"maxn = ",7);
                plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,args->maxn);
                std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
                std::ostream::put((char)plVar1);
                std::ostream::flush();
                if (2 < autotuneArgs->verbose) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"bucket = ",9);
                  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,args->bucket);
                  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
                  std::ostream::put((char)plVar1);
                  std::ostream::flush();
                  if (2 < autotuneArgs->verbose) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"dsub = ",7);
                    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
                    std::ostream::put((char)poVar2);
                    std::ostream::flush();
                    if (2 < autotuneArgs->verbose) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"loss = ",7);
                      Args::lossToString_abi_cxx11_(&local_38,args,args->loss);
                      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&std::cout,local_38._M_dataplus._M_p,
                                          local_38._M_string_length);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2)
                      ;
                      std::ostream::put((char)poVar2);
                      std::ostream::flush();
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_38._M_dataplus._M_p != &local_38.field_2) {
                        operator_delete(local_38._M_dataplus._M_p);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Autotune::printArgs(const Args& args, const Args& autotuneArgs) {
  LOG_VAL(epoch, args.epoch)
  LOG_VAL(lr, args.lr)
  LOG_VAL(dim, args.dim)
  LOG_VAL(minCount, args.minCount)
  LOG_VAL(wordNgrams, args.wordNgrams)
  LOG_VAL(minn, args.minn)
  LOG_VAL(maxn, args.maxn)
  LOG_VAL(bucket, args.bucket)
  LOG_VAL(dsub, args.dsub)
  LOG_VAL(loss, args.lossToString(args.loss))
}